

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

int32_t ra_get_index(roaring_array_t *ra,uint16_t x)

{
  uint16_t x_local;
  roaring_array_t *ra_local;
  
  if ((ra->size == 0) || (ra->keys[ra->size + -1] == x)) {
    ra_local._4_4_ = ra->size + -1;
  }
  else {
    ra_local._4_4_ = binarySearch(ra->keys,ra->size,x);
  }
  return ra_local._4_4_;
}

Assistant:

inline int32_t ra_get_index(const roaring_array_t *ra, uint16_t x) {
    if ((ra->size == 0) || ra->keys[ra->size - 1] == x) return ra->size - 1;
    return binarySearch(ra->keys, (int32_t)ra->size, x);
}